

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViewState.cpp
# Opt level: O2

void __thiscall ViewState::handle_message(ViewState *this,Message *msg,Node *node)

{
  state_t sVar1;
  network_address_t nVar2;
  size_t sVar3;
  Block bNew;
  
  sVar1 = this->_state;
  if (sVar1 == WAIT_BLOCK) {
    if (msg->msg_type == UNPACK) {
      Node::GetOutBk(node);
      return;
    }
  }
  else if (sVar1 == COMFIRM_TRANS) {
    sVar3 = this->accepted_confirm;
    if (msg->msg_type == CONFIRM) {
      sVar3 = sVar3 + 1;
      this->accepted_confirm = sVar3;
    }
    if (sVar3 == 2) {
      Node::TransToCache(node,msg);
      Node::SealTrans(&bNew,node);
      if ((msg->n + 1) % 400 == 0) {
        Node::SendBlock(node,&bNew);
        Node::SendUnpack(node,msg);
        sVar1 = SEND_BLOCK;
      }
      else {
        sVar1 = WAIT_BLOCK;
      }
      this->_state = sVar1;
      Block::~Block(&bNew);
    }
  }
  else if (sVar1 == SEND_TRANS) {
    msg->msg_type = CONFIRM;
    nVar2 = Node::GetNodeAdd(node);
    msg->i = nVar2;
    sVar3 = Node::GetTransNum(node);
    msg->n = sVar3;
    Node::SendAll(node,msg);
    nVar2 = Node::GetNodeAdd(node);
    if (nVar2 == 2) {
      this->_state = COMFIRM_TRANS;
    }
    else {
      this->_state = WAIT_BLOCK;
    }
  }
  return;
}

Assistant:

void ViewState::handle_message(Message msg, Node & node) {
  switch (_state) {
  case SEND_TRANS: {
    // TODO：主节点验证客户端请求消息签名是否正确，如果正确，则
    msg.msg_type = Message::CONFIRM;
    msg.i = node.GetNodeAdd();
    msg.n = node.GetTransNum();
    node.SendAll(msg);
    if (node.GetNodeAdd() == 2)
      _state = COMFIRM_TRANS;
    else {
      _state = WAIT_BLOCK;
    }
  }
  break;
  case WAIT_BLOCK:
  {
    if (msg.msg_type == Message::UNPACK)
    {
      //std::cout << "节点：" << node.GetNodeAdd() <<" 添加区块。"<<std::endl;
      node.GetOutBk();
    }

  }
  break;
  case COMFIRM_TRANS: {
    // TODO：副本节点验证
    //  a. 主节点PRE-PREPARE消息签名是否正确。
    //  b. 当前副本节点是否已经收到了一条在同一v下并且编号也是n，但是签名不同的PRE-PREPARE信息。
    //  c. d与m的摘要是否一致。
    //  d. n是否在区间[h, H]内。
    //  如果正确，则

    if (msg.msg_type == Message::CONFIRM) {
      accepted_confirm++;
    }
    if (accepted_confirm == k_value) // TODO:K_CA
    {
        //std::cout << "节点：" << node.GetNodeAdd() << " 达到k确认！"
                  //<< std::endl;
        node.TransToCache(msg);
        Block bNew = node.SealTrans();
        if ((msg.n+1)%400 == 0)
        {
          node.SendBlock(bNew);
          node.SendUnpack(msg);
          _state = SEND_BLOCK;
        }
        else
          _state = WAIT_BLOCK;
    }
  }
  break;
  case SEND_BLOCK:
    break;
  }
}